

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variant.cc
# Opt level: O0

void __thiscall variant_emplace_Test::~variant_emplace_Test(variant_emplace_Test *this)

{
  variant_emplace_Test *this_local;
  
  ~variant_emplace_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(variant, emplace) {
    static constexpr int expected = 42;

    Variant<A, B> v{};

    ASSERT_FALSE(v.holds<A>());
    const auto& a = v.emplace<A>(expected);

    EXPECT_EQ(a.value, expected);
    ASSERT_TRUE(v.holds<A>());
    EXPECT_EQ(v.get<A>().value, expected);
}